

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadlocal-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase33::run(TestCase33 *this)

{
  Iface *pIVar1;
  long in_FS_OFFSET;
  bool threadDone;
  uint j;
  uint i;
  char local_69;
  _func_int *local_68;
  Function<void_()> local_60;
  uint *local_50;
  undefined4 local_48;
  uint local_44;
  Thread local_40;
  
  local_68 = *(_func_int **)(in_FS_OFFSET + -0x10);
  if ((local_68 != (_func_int *)0x0) && (_::Debug::minSeverity < 3)) {
    local_50 = (uint *)0x0;
    _::Debug::log<char_const(&)[34],decltype(nullptr),unsigned_int*&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/threadlocal-test.c++"
               ,0x24,ERROR,"\"failed: expected \" \"(nullptr) == (p)\", nullptr, p",
               (char (*) [34])"failed: expected (nullptr) == (p)",&local_50,(uint **)&local_68);
  }
  local_44 = 0x7b;
  *(uint **)(in_FS_OFFSET + -0x10) = &local_44;
  local_68 = (_func_int *)0x0;
  local_48 = 0x1c8;
  local_69 = '\0';
  local_60.impl.ptr = (Iface *)operator_new(0x20);
  (local_60.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___001b9f70;
  local_60.impl.ptr[1]._vptr_Iface = &local_68;
  local_60.impl.ptr[2]._vptr_Iface = (_func_int **)&local_48;
  local_60.impl.ptr[3]._vptr_Iface = (_func_int **)&local_69;
  local_60.impl.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::Function<void()>::Impl<kj::(anonymous_namespace)::TestCase33::run()::$_0>>
        ::instance;
  Thread::Thread(&local_40,&local_60);
  Thread::~Thread(&local_40);
  pIVar1 = local_60.impl.ptr;
  if (local_60.impl.ptr != (Iface *)0x0) {
    local_60.impl.ptr = (Iface *)0x0;
    (**(local_60.impl.disposer)->_vptr_Disposer)
              (local_60.impl.disposer,pIVar1->_vptr_Iface[-2] + (long)&pIVar1->_vptr_Iface);
  }
  if (_::Debug::minSeverity < 3 && local_69 == '\0') {
    _::Debug::log<char_const(&)[28]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/threadlocal-test.c++"
               ,0x3d,ERROR,"\"failed: expected \" \"threadDone\"",
               (char (*) [28])"failed: expected threadDone");
  }
  local_68 = *(_func_int **)(in_FS_OFFSET + -0x10);
  if (((_func_int *)&local_44 != local_68) && (_::Debug::minSeverity < 3)) {
    local_50 = &local_44;
    _::Debug::log<char_const(&)[29],unsigned_int*,unsigned_int*&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/threadlocal-test.c++"
               ,0x41,ERROR,"\"failed: expected \" \"(&i) == (p)\", &i, p",
               (char (*) [29])"failed: expected (&i) == (p)",&local_50,(uint **)&local_68);
  }
  return;
}

Assistant:

TEST(ThreadLocal, Basic) {
  // Verify that both started out null.
  uint* p = tls1;
  EXPECT_EQ(nullptr, p);
  p = tls2;
  EXPECT_EQ(nullptr, p);

  // Set tls1, then verify that only tls1 changed, not tls2.
  uint i = 123;
  tls1 = &i;

  p = tls1;
  EXPECT_EQ(&i, p);
  p = tls2;
  EXPECT_EQ(nullptr, p);

  // Check that in another thread, tls1 starts null but can be changed.
  uint j = 456;
  bool threadDone = false;
  Thread([&]() {
    p = tls1;
    EXPECT_EQ(nullptr, p);
    tls1 = &j;

    p = tls1;
    EXPECT_EQ(&j, p);
    threadDone = true;
  });
  EXPECT_TRUE(threadDone);

  // tls1 didn't change in this thread.
  p = tls1;
  EXPECT_EQ(&i, p);
}